

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264.c
# Opt level: O0

int h264_seqparm_mvc(bitstream *str,h264_seqparm *seqparm)

{
  int iVar1;
  void *pvVar2;
  long in_RSI;
  int *in_RDI;
  bool bVar3;
  uint32_t mvc_vui_parameters_present_flag;
  int k;
  int j;
  int i;
  uint32_t bit_equal_to_one;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  uint uVar4;
  uint local_20;
  int local_4;
  
  if (*in_RDI == 1) {
    *(undefined4 *)(in_RSI + 0xc98) = 1;
  }
  iVar1 = vs_u((bitstream *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               (uint32_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffcc);
  if (iVar1 == 0) {
    iVar1 = vs_ue((bitstream *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                  (uint32_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    if (iVar1 == 0) {
      if (*in_RDI == 1) {
        pvVar2 = calloc(0x104,(ulong)(*(int *)(in_RSI + 0xc9c) + 1));
        *(void **)(in_RSI + 0xca0) = pvVar2;
      }
      for (local_20 = 0; local_20 <= *(uint *)(in_RSI + 0xc9c); local_20 = local_20 + 1) {
        iVar1 = vs_ue((bitstream *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                      (uint32_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        if (iVar1 != 0) {
          return 1;
        }
      }
      for (local_20 = 1; local_20 <= *(uint *)(in_RSI + 0xc9c); local_20 = local_20 + 1) {
        iVar1 = vs_ue((bitstream *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                      (uint32_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        if (iVar1 != 0) {
          return 1;
        }
        if (0xf < *(uint *)(*(long *)(in_RSI + 0xca0) + (long)(int)local_20 * 0x104 + 4)) {
          fprintf(_stderr,"num_anchor_refs_l0 over limit\n");
          return 1;
        }
        for (uVar4 = 0;
            uVar4 < *(uint *)(*(long *)(in_RSI + 0xca0) + (long)(int)local_20 * 0x104 + 4);
            uVar4 = uVar4 + 1) {
          iVar1 = vs_ue((bitstream *)CONCAT44(uVar4,in_stack_ffffffffffffffd8),
                        (uint32_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
          if (iVar1 != 0) {
            return 1;
          }
        }
        iVar1 = vs_ue((bitstream *)CONCAT44(uVar4,in_stack_ffffffffffffffd8),
                      (uint32_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        if (iVar1 != 0) {
          return 1;
        }
        if (0xf < *(uint *)(*(long *)(in_RSI + 0xca0) + (long)(int)local_20 * 0x104 + 0x44)) {
          fprintf(_stderr,"num_anchor_refs_l1 over limit\n");
          return 1;
        }
        for (in_stack_ffffffffffffffdc = 0;
            in_stack_ffffffffffffffdc <
            *(uint *)(*(long *)(in_RSI + 0xca0) + (long)(int)local_20 * 0x104 + 0x44);
            in_stack_ffffffffffffffdc = in_stack_ffffffffffffffdc + 1) {
          iVar1 = vs_ue((bitstream *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                        (uint32_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
          if (iVar1 != 0) {
            return 1;
          }
        }
      }
      for (local_20 = 1; local_20 <= *(uint *)(in_RSI + 0xc9c); local_20 = local_20 + 1) {
        iVar1 = vs_ue((bitstream *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                      (uint32_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        if (iVar1 != 0) {
          return 1;
        }
        if (0xf < *(uint *)(*(long *)(in_RSI + 0xca0) + (long)(int)local_20 * 0x104 + 0x84)) {
          fprintf(_stderr,"num_non_anchor_refs_l0 over limit\n");
          return 1;
        }
        for (uVar4 = 0;
            uVar4 < *(uint *)(*(long *)(in_RSI + 0xca0) + (long)(int)local_20 * 0x104 + 0x84);
            uVar4 = uVar4 + 1) {
          iVar1 = vs_ue((bitstream *)CONCAT44(uVar4,in_stack_ffffffffffffffd8),
                        (uint32_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
          if (iVar1 != 0) {
            return 1;
          }
        }
        iVar1 = vs_ue((bitstream *)CONCAT44(uVar4,in_stack_ffffffffffffffd8),
                      (uint32_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        if (iVar1 != 0) {
          return 1;
        }
        if (0xf < *(uint *)(*(long *)(in_RSI + 0xca0) + (long)(int)local_20 * 0x104 + 0xc4)) {
          fprintf(_stderr,"num_non_anchor_refs_l1 over limit\n");
          return 1;
        }
        for (in_stack_ffffffffffffffdc = 0;
            in_stack_ffffffffffffffdc <
            *(uint *)(*(long *)(in_RSI + 0xca0) + (long)(int)local_20 * 0x104 + 0xc4);
            in_stack_ffffffffffffffdc = in_stack_ffffffffffffffdc + 1) {
          iVar1 = vs_ue((bitstream *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                        (uint32_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
          if (iVar1 != 0) {
            return 1;
          }
        }
      }
      iVar1 = vs_ue((bitstream *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                    (uint32_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      if (iVar1 == 0) {
        if (*in_RDI == 1) {
          pvVar2 = calloc(0x10,(ulong)(*(int *)(in_RSI + 0xca8) + 1));
          *(void **)(in_RSI + 0xcb0) = pvVar2;
        }
        for (local_20 = 0; local_20 <= *(uint *)(in_RSI + 0xca8); local_20 = local_20 + 1) {
          iVar1 = vs_u((bitstream *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                       (uint32_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffcc);
          if (iVar1 != 0) {
            return 1;
          }
          iVar1 = vs_ue((bitstream *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                        (uint32_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
          if (iVar1 != 0) {
            return 1;
          }
          if (*in_RDI == 1) {
            pvVar2 = calloc(0x18,(ulong)(*(int *)(*(long *)(in_RSI + 0xcb0) +
                                                  (long)(int)local_20 * 0x10 + 4) + 1));
            *(void **)(*(long *)(in_RSI + 0xcb0) + (long)(int)local_20 * 0x10 + 8) = pvVar2;
          }
          for (in_stack_ffffffffffffffdc = 0;
              in_stack_ffffffffffffffdc <=
              *(uint *)(*(long *)(in_RSI + 0xcb0) + (long)(int)local_20 * 0x10 + 4);
              in_stack_ffffffffffffffdc = in_stack_ffffffffffffffdc + 1) {
            iVar1 = vs_u((bitstream *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                         (uint32_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                         in_stack_ffffffffffffffcc);
            if (iVar1 != 0) {
              return 1;
            }
            iVar1 = vs_ue((bitstream *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)
                          ,(uint32_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
                         );
            if (iVar1 != 0) {
              return 1;
            }
            if (*in_RDI == 1) {
              pvVar2 = calloc(4,(ulong)(*(int *)(*(long *)(*(long *)(in_RSI + 0xcb0) +
                                                           (long)(int)local_20 * 0x10 + 8) +
                                                 (long)(int)in_stack_ffffffffffffffdc * 0x18 + 4) +
                                       1));
              *(void **)(*(long *)(*(long *)(in_RSI + 0xcb0) + (long)(int)local_20 * 0x10 + 8) +
                         (long)(int)in_stack_ffffffffffffffdc * 0x18 + 8) = pvVar2;
            }
            for (in_stack_ffffffffffffffd8 = 0;
                in_stack_ffffffffffffffd8 <=
                *(uint *)(*(long *)(*(long *)(in_RSI + 0xcb0) + (long)(int)local_20 * 0x10 + 8) +
                          (long)(int)in_stack_ffffffffffffffdc * 0x18 + 4);
                in_stack_ffffffffffffffd8 = in_stack_ffffffffffffffd8 + 1) {
              iVar1 = vs_ue((bitstream *)
                            CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                            (uint32_t *)
                            CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
              if (iVar1 != 0) {
                return 1;
              }
            }
            iVar1 = vs_ue((bitstream *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)
                          ,(uint32_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
                         );
            if (iVar1 != 0) {
              return 1;
            }
          }
        }
        bVar3 = *(long *)(in_RSI + 0xcb8) != 0;
        uVar4 = (uint)bVar3;
        iVar1 = vs_u((bitstream *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                     (uint32_t *)(ulong)CONCAT14(bVar3,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffcc);
        if (iVar1 == 0) {
          if (uVar4 == 0) {
            *(undefined8 *)(in_RSI + 0xcb8) = 0;
          }
          else {
            if (*in_RDI == 1) {
              pvVar2 = calloc(0x88,1);
              *(void **)(in_RSI + 0xcb8) = pvVar2;
            }
            iVar1 = h264_mvc_vui_parameters
                              ((bitstream *)CONCAT44(uVar4,in_stack_ffffffffffffffd0),
                               (h264_vui *)
                               CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
            if (iVar1 != 0) {
              return 1;
            }
          }
          local_4 = 0;
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int h264_seqparm_mvc(struct bitstream *str, struct h264_seqparm *seqparm) {
	uint32_t bit_equal_to_one = 1;
	int i, j, k;
	if (str->dir == VS_DECODE)
		seqparm->is_mvc = 1;
	if (vs_u(str, &bit_equal_to_one, 1)) return 1;
	if (!bit_equal_to_one) {
		fprintf(stderr, "bit_equal_to_one invalid\n");
		return 1;
	}
	if (vs_ue(str, &seqparm->num_views_minus1)) return 1;
	if (str->dir == VS_DECODE)
		seqparm->views = calloc(sizeof *seqparm->views, seqparm->num_views_minus1 + 1);
	for (i = 0; i <= seqparm->num_views_minus1; i++)
		if (vs_ue(str, &seqparm->views[i].view_id)) return 1;
	for (i = 1; i <= seqparm->num_views_minus1; i++) {
		if (vs_ue(str, &seqparm->views[i].num_anchor_refs_l0)) return 1;
		if (seqparm->views[i].num_anchor_refs_l0 > 15) {
			fprintf (stderr, "num_anchor_refs_l0 over limit\n");
			return 1;
		}
		for (j = 0; j < seqparm->views[i].num_anchor_refs_l0; j++)
			if (vs_ue(str, &seqparm->views[i].anchor_ref_l0[j])) return 1;
		if (vs_ue(str, &seqparm->views[i].num_anchor_refs_l1)) return 1;
		if (seqparm->views[i].num_anchor_refs_l1 > 15) {
			fprintf (stderr, "num_anchor_refs_l1 over limit\n");
			return 1;
		}
		for (j = 0; j < seqparm->views[i].num_anchor_refs_l1; j++)
			if (vs_ue(str, &seqparm->views[i].anchor_ref_l1[j])) return 1;
	}
	for (i = 1; i <= seqparm->num_views_minus1; i++) {
		if (vs_ue(str, &seqparm->views[i].num_non_anchor_refs_l0)) return 1;
		if (seqparm->views[i].num_non_anchor_refs_l0 > 15) {
			fprintf (stderr, "num_non_anchor_refs_l0 over limit\n");
			return 1;
		}
		for (j = 0; j < seqparm->views[i].num_non_anchor_refs_l0; j++)
			if (vs_ue(str, &seqparm->views[i].non_anchor_ref_l0[j])) return 1;
		if (vs_ue(str, &seqparm->views[i].num_non_anchor_refs_l1)) return 1;
		if (seqparm->views[i].num_non_anchor_refs_l1 > 15) {
			fprintf (stderr, "num_non_anchor_refs_l1 over limit\n");
			return 1;
		}
		for (j = 0; j < seqparm->views[i].num_non_anchor_refs_l1; j++)
			if (vs_ue(str, &seqparm->views[i].non_anchor_ref_l1[j])) return 1;
	}
	if (vs_ue(str, &seqparm->num_level_values_signalled_minus1)) return 1;
	if (str->dir == VS_DECODE)
		seqparm->levels = calloc(sizeof *seqparm->levels, seqparm->num_level_values_signalled_minus1 + 1);
	for (i = 0; i <= seqparm->num_level_values_signalled_minus1; i++) {
		if (vs_u(str, &seqparm->levels[i].level_idc, 8)) return 1;
		if (vs_ue(str, &seqparm->levels[i].num_applicable_ops_minus1)) return 1;
		if (str->dir == VS_DECODE)
			seqparm->levels[i].applicable_ops = calloc(sizeof *seqparm->levels[i].applicable_ops, seqparm->levels[i].num_applicable_ops_minus1 + 1);
		for (j = 0; j <= seqparm->levels[i].num_applicable_ops_minus1; j++) {
			if (vs_u(str, &seqparm->levels[i].applicable_ops[j].temporal_id, 3)) return 1;
			if (vs_ue(str, &seqparm->levels[i].applicable_ops[j].num_target_views_minus1)) return 1;
			if (str->dir == VS_DECODE)
				seqparm->levels[i].applicable_ops[j].target_view_id = calloc(sizeof *seqparm->levels[i].applicable_ops[j].target_view_id, seqparm->levels[i].applicable_ops[j].num_target_views_minus1 + 1);
			for (k = 0; k <= seqparm->levels[i].applicable_ops[j].num_target_views_minus1; k++)
				if (vs_ue(str, &seqparm->levels[i].applicable_ops[j].target_view_id[k])) return 1;
			if (vs_ue(str, &seqparm->levels[i].applicable_ops[j].num_views_minus1)) return 1;
		}
	}
	uint32_t mvc_vui_parameters_present_flag = !!(seqparm->mvc_vui);
	if (vs_u(str, &mvc_vui_parameters_present_flag, 1)) return 1;
	if (mvc_vui_parameters_present_flag) {
		if (str->dir == VS_DECODE) {
			seqparm->mvc_vui = calloc (sizeof *seqparm->mvc_vui, 1);
		}
		if (h264_mvc_vui_parameters(str, seqparm->mvc_vui)) return 1;
	} else {
		seqparm->mvc_vui = 0;
	}
	return 0;
}